

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void amrex::anon_unknown_12::addDefn
               (string *def,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *val,list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                    *tab)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  int iVar3;
  ostream *poVar4;
  _Node *p_Var5;
  PP_entry local_68;
  
  if (def->_M_string_length != 0) {
    if ((val->
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)val) {
      poVar4 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"ParmParse::addDefn(): no values for definition ",0x2f);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(def->_M_dataplus)._M_p,def->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      Abort_host((char *)0x0);
    }
    __n = def->_M_string_length;
    if ((__n == DAT_007563a8) &&
       (((__n == 0 ||
         (iVar3 = bcmp((def->_M_dataplus)._M_p,ParmParse::FileKeyword_abi_cxx11_,__n), iVar3 == 0))
        && ((val->
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl._M_node._M_size == 1)))) {
      read_file((char *)(val->
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl._M_node.super__List_node_base._M_next[1]._M_next,tab);
    }
    else {
      ParmParse::PP_entry::PP_entry(&local_68,def,val);
      p_Var5 = std::__cxx11::
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
               _M_create_node<amrex::ParmParse::PP_entry>(tab,&local_68);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      psVar1 = &(tab->
                super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      ParmParse::PP_entry::~PP_entry(&local_68);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&val->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    (val->
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)val;
    (val->
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)val;
    (val->
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl._M_node._M_size = 0;
    paVar2 = &local_68.m_name.field_2;
    local_68.m_name._M_string_length = 0;
    local_68.m_name.field_2._M_local_buf[0] = '\0';
    local_68.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::operator=((string *)def,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_68.m_name._M_dataplus._M_p,
                      CONCAT71(local_68.m_name.field_2._M_allocated_capacity._1_7_,
                               local_68.m_name.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&val->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  (val->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)val;
  (val->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)val;
  (val->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void
addDefn (std::string&         def,
         std::list<std::string>&   val,
         std::list<ParmParse::PP_entry>& tab)
{
    //
    // Check that defn exists.
    //
    if ( def.empty() )
    {
        val.clear();
        return;
    }
    //
    // Check that it has values.
    //
    if ( val.empty() )
    {
        amrex::ErrorStream() << "ParmParse::addDefn(): no values for definition " << def << "\n";
        amrex::Abort();
    }
    //
    // Check if this defn is a file include directive.
    //
    if ( def == ParmParse::FileKeyword && val.size() == 1 )
    {
        //
        // Read file and add to this table.
        //
        const char* fname = val.front().c_str();
        read_file(fname, tab);
    }
    else
    {
        tab.push_back(ParmParse::PP_entry(def,val));
    }
    val.clear();
    def = std::string();
}